

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::DisposableOwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_>::disposeImpl
          (DisposableOwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_> *this,
          void *pointer)

{
  Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>::dispose
            (&(this->super_OwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_>).
              first);
  operator_delete(this,0x10);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }